

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O2

void __thiscall
BayesianGameWithClusterInfo::BayesianGameWithClusterInfo
          (BayesianGameWithClusterInfo *this,PlanningUnitDecPOMDPDiscrete *pu,
          QFunctionJAOHInterface *q,shared_ptr<const_PartialJointPolicyDiscretePure> *pastJPol,
          BGClusterAlgorithm clusterAlg)

{
  BayesianGameIdenticalPayoff *this_00;
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  *this_01;
  value_type_conflict1 *__value;
  uint uVar1;
  value_type vVar2;
  _func_int *p_Var3;
  PlanningUnitDecPOMDPDiscrete *pPVar4;
  element_type *peVar5;
  vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *pvVar6;
  undefined8 uVar7;
  Index i;
  int iVar8;
  Index IVar9;
  uint uVar10;
  QFunctionJointBeliefInterface *pQVar11;
  QHybrid *pQVar12;
  undefined4 extraout_var;
  LIndex i_00;
  undefined4 extraout_var_00;
  size_t sVar13;
  Type *t;
  TypeCluster *this_02;
  reference ppvVar14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_03;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  const_reference pvVar15;
  reference ppTVar16;
  long lVar17;
  reference pvVar18;
  ulong uVar19;
  undefined1 *puVar20;
  ulong uVar21;
  undefined **ppuVar22;
  Index *oIs;
  ulong uVar23;
  uint *puVar24;
  ulong uVar25;
  Index agI;
  uint uVar26;
  pointer __n;
  undefined1 auStack_f8 [8];
  TypeCluster *local_f0;
  TypeCluster *tc;
  shared_ptr<const_PartialJointPolicyDiscretePure> *local_d8;
  undefined1 *local_d0;
  _func_int **local_c8;
  undefined8 local_c0;
  ulong local_b8;
  ulong local_b0;
  undefined1 auStack_a8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> observations;
  undefined1 auStack_88 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> actions;
  ulong local_48;
  allocator_type local_31;
  
  puVar20 = auStack_f8;
  local_d8 = pastJPol;
  BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
            (&this->super_BayesianGameForDecPOMDPStage,pu,q,pastJPol);
  ppuVar22 = &PTR__BayesianGameWithClusterInfo_005d8638;
  (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface.
  _vptr_BayesianGameForDecPOMDPStageInterface =
       (_func_int **)&PTR__BayesianGameWithClusterInfo_005d85e8;
  (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
  super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
  super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
  _vptr_Interface_ProblemToPolicyDiscrete = (_func_int **)&PTR__BayesianGameWithClusterInfo_005d8638
  ;
  (this->_m_pBG).px = (element_type *)0x0;
  (this->_m_pBG).pn.pi_ = (sp_counted_base *)0x0;
  if (q == (QFunctionJAOHInterface *)0x0) {
    this->_m_qJB = (QFunctionJointBeliefInterface *)0x0;
    pQVar12 = (QHybrid *)0x0;
  }
  else {
    pQVar11 = (QFunctionJointBeliefInterface *)
              __dynamic_cast(q,&QFunctionJAOHInterface::typeinfo,
                             &QFunctionJointBeliefInterface::typeinfo,0xfffffffffffffffe);
    this->_m_qJB = pQVar11;
    pQVar12 = (QHybrid *)__dynamic_cast(q,&QFunctionJAOHInterface::typeinfo,&QHybrid::typeinfo,0);
  }
  this->_m_qHybrid = pQVar12;
  this_00 = &(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff;
  uVar10 = 0;
  (this->_m_pBGJPol).px = (element_type *)0x0;
  (this->_m_pBGJPol).pn.pi_ = (sp_counted_base *)0x0;
  (this->_m_jaohReps).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_jaohReps).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_jaohReps).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_typeLists).
  super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_typeLists).
  super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_typeLists).
  super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_m_clusterAlgorithm = clusterAlg;
  this_01 = &this->_m_typeLists;
  this->_m_thresholdJB = (double)SUB168(ZEXT416(0) << 0x40,0);
  this->_m_thresholdPjaoh = (double)SUB168(ZEXT416(0) << 0x40,8);
  uVar26 = (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface.
           _m_t;
  uVar23 = (ulong)uVar26;
  local_c8 = (_func_int **)&PTR__Type_005d8938;
  local_b0 = (ulong)(uVar26 - 1);
  local_b8 = uVar23 * 4 + 0xf & 0xfffffffffffffff0;
  while( true ) {
    p_Var3 = ((_func_int **)ppuVar22)[3];
    *(undefined8 *)(puVar20 + -8) = 0x3f7366;
    iVar8 = (*p_Var3)(this_00);
    __n = (pointer)(ulong)uVar10;
    if ((pointer)CONCAT44(extraout_var,iVar8) <= __n) break;
    *(undefined8 *)(puVar20 + -8) = 0x18;
    uVar19 = *(ulong *)(puVar20 + -8);
    *(undefined8 *)(puVar20 + -8) = 0x3f737a;
    auStack_88 = (undefined1  [8])operator_new(uVar19);
    (((vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)auStack_88)->
    super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (((vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)auStack_88)->
    super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (((vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)auStack_88)->
    super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)(puVar20 + -8) = 0x3f7398;
    std::
    vector<std::vector<TypeCluster*,std::allocator<TypeCluster*>>*,std::allocator<std::vector<TypeCluster*,std::allocator<TypeCluster*>>*>>
    ::emplace_back<std::vector<TypeCluster*,std::allocator<TypeCluster*>>*>
              ((vector<std::vector<TypeCluster*,std::allocator<TypeCluster*>>*,std::allocator<std::vector<TypeCluster*,std::allocator<TypeCluster*>>*>>
                *)this_01,(vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> **)auStack_88);
    pPVar4 = (this->super_BayesianGameForDecPOMDPStage)._m_pu;
    *(undefined8 *)(puVar20 + -8) = 0x3f73ae;
    i_00 = PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex
                     (&pPVar4->super_PlanningUnitMADPDiscrete,uVar10,uVar26);
    *(undefined8 *)(puVar20 + -8) = 0x3f73b6;
    IVar9 = Globals::CastLIndexToIndex(i_00);
    local_c0 = CONCAT44(extraout_var_00,IVar9);
    local_48 = 0;
    observations.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = __n;
    while( true ) {
      IVar9 = (Index)__n;
      *(undefined8 *)(puVar20 + -8) = 0x3f73d7;
      sVar13 = BayesianGameBase::GetNrTypes((BayesianGameBase *)this_00,IVar9);
      if (sVar13 <= local_48) break;
      actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      observations.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_88 = (undefined1  [8])0x0;
      actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      auStack_a8 = (undefined1  [8])0x0;
      observations.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      i = (Index)local_48;
      if (uVar23 != 0) {
        iVar8 = (int)local_c0;
        oIs = (Index *)(puVar20 + -local_b8);
        puVar24 = (uint *)((long)oIs - local_b8);
        pPVar4 = (this->super_BayesianGameForDecPOMDPStage)._m_pu;
        puVar24[-2] = 0x3f744d;
        puVar24[-1] = 0;
        PlanningUnitMADPDiscrete::GetObservationHistoryArrays
                  (&pPVar4->super_PlanningUnitMADPDiscrete,IVar9,i + iVar8,uVar26,oIs);
        local_d0 = puVar20;
        uVar19 = 0;
        for (uVar25 = 0; uVar21 = local_b0, uVar23 != uVar25; uVar25 = uVar25 + 1) {
          peVar5 = local_d8->px;
          agI = (Index)observations.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
          uVar21 = (ulong)observations.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage & 0xffffffff;
          p_Var3 = (peVar5->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
                   super_JointPolicy._vptr_JointPolicy[0x13];
          puVar24[-2] = 0x3f747e;
          puVar24[-1] = 0;
          uVar10 = (*p_Var3)(peVar5,uVar21,uVar19);
          puVar24[uVar25] = uVar10;
          IVar9 = oIs[uVar25];
          pPVar4 = (this->super_BayesianGameForDecPOMDPStage)._m_pu;
          puVar24[-2] = 0x3f749c;
          puVar24[-1] = 0;
          IVar9 = PlanningUnitMADPDiscrete::GetSuccessorOHI
                            (&pPVar4->super_PlanningUnitMADPDiscrete,agI,(Index)uVar19,IVar9);
          uVar19 = (ulong)IVar9;
        }
        __value = puVar24 + local_b0;
        puVar24[-2] = 0x3f74c9;
        puVar24[-1] = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffff10,
                   (ulong)*puVar24,__value,&local_31);
        puVar24[-2] = 0x3f74d5;
        puVar24[-1] = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_88,
                   (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &stack0xffffffffffffff10);
        puVar24[-2] = 0x3f74dd;
        puVar24[-1] = 0;
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &stack0xffffffffffffff10);
        uVar10 = *oIs;
        puVar24[-2] = 0x3f74f0;
        puVar24[-1] = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffff10,
                   (ulong)uVar10,oIs + uVar21,&local_31);
        puVar24[-2] = 0x3f74ff;
        puVar24[-1] = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_a8,
                   (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &stack0xffffffffffffff10);
        puVar24[-2] = 0x3f7507;
        puVar24[-1] = 0;
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &stack0xffffffffffffff10);
        puVar20 = local_d0;
        __n = observations.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
      }
      pPVar4 = (this->super_BayesianGameForDecPOMDPStage)._m_pu;
      *(undefined8 *)(puVar20 + -8) = 0x3f753e;
      IVar9 = PlanningUnitMADPDiscrete::GetActionObservationHistoryIndex
                        (&pPVar4->super_PlanningUnitMADPDiscrete,(Index)__n,uVar26,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_88,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_a8);
      *(undefined8 *)(puVar20 + -8) = 0x10;
      uVar19 = *(ulong *)(puVar20 + -8);
      *(undefined8 *)(puVar20 + -8) = 0x3f7549;
      t = (Type *)operator_new(uVar19);
      t->_m_sc = AOHINDEX;
      t->_vptr_Type = local_c8;
      *(Index *)&t->field_0xc = IVar9;
      *(undefined8 *)(puVar20 + -8) = 0x38;
      uVar19 = *(ulong *)(puVar20 + -8);
      *(undefined8 *)(puVar20 + -8) = 0x3f7569;
      this_02 = (TypeCluster *)operator_new(uVar19);
      *(undefined8 *)(puVar20 + -8) = 0x3f7578;
      TypeCluster::TypeCluster(this_02,i);
      local_f0 = this_02;
      *(undefined8 *)(puVar20 + -8) = 0x3f758a;
      TypeCluster::AddType(this_02,t);
      *(undefined8 *)(puVar20 + -8) = 0x3f7596;
      ppvVar14 = std::
                 vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                 ::at(this_01,(size_type)__n);
      pvVar6 = *ppvVar14;
      *(undefined8 *)(puVar20 + -8) = 0x3f75a5;
      std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::push_back
                (pvVar6,&stack0xffffffffffffff10);
      local_48 = (ulong)(i + 1);
      *(undefined8 *)(puVar20 + -8) = 0x3f75bb;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_a8);
      *(undefined8 *)(puVar20 + -8) = 0x3f75c4;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_88);
    }
    ppuVar22 = (this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
               super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
               _vptr_Interface_ProblemToPolicyDiscrete;
    uVar10 = IVar9 + 1;
  }
  *(undefined8 *)(puVar20 + -8) = 0x3f75dc;
  sVar13 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)this_00);
  *(undefined8 *)(puVar20 + -8) = 0x3f75ef;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_88,sVar13,
             (allocator_type *)auStack_a8);
  *(undefined8 *)(puVar20 + -8) = 0x3f75ff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&this->_m_jaohReps,
             (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_88);
  *(undefined8 *)(puVar20 + -8) = 0x3f7607;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_88);
  uVar26 = 0;
  while( true ) {
    *(undefined8 *)(puVar20 + -8) = 0x3f761a;
    sVar13 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)this_00);
    if (sVar13 <= uVar26) break;
    *(undefined8 *)(puVar20 + -8) = 0x3f7639;
    this_03 = BayesianGameBase::JointToIndividualTypeIndices((BayesianGameBase *)this_00,uVar26);
    p_Var3 = (this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
             super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
             _vptr_Interface_ProblemToPolicyDiscrete[3];
    *(undefined8 *)(puVar20 + -8) = 0x3f7645;
    iVar8 = (*p_Var3)(this_00);
    *(undefined8 *)(puVar20 + -8) = 0x3f7657;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_88,
               CONCAT44(extraout_var_01,iVar8),(allocator_type *)auStack_a8);
    uVar10 = 0;
    while( true ) {
      p_Var3 = (this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
               super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
               _vptr_Interface_ProblemToPolicyDiscrete[3];
      *(undefined8 *)(puVar20 + -8) = 0x3f7664;
      iVar8 = (*p_Var3)();
      uVar23 = (ulong)uVar10;
      if (CONCAT44(extraout_var_02,iVar8) <= uVar23) break;
      *(undefined8 *)(puVar20 + -8) = 0x3f7677;
      pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_03,uVar23);
      uVar1 = *pvVar15;
      *(undefined8 *)(puVar20 + -8) = 0x3f7685;
      ppvVar14 = std::
                 vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                 ::at(this_01,uVar23);
      pvVar6 = *ppvVar14;
      *(undefined8 *)(puVar20 + -8) = 0x3f7690;
      ppTVar16 = std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::at(pvVar6,(ulong)uVar1)
      ;
      uVar7 = *(undefined8 *)
               (((*ppTVar16)->_m_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1);
      *(undefined8 *)(puVar20 + -8) = 0x3f76ac;
      lVar17 = __dynamic_cast(uVar7,&Type::typeinfo,&Type_AOHIndex::typeinfo,0);
      vVar2 = *(value_type *)(lVar17 + 0xc);
      *(undefined8 *)(puVar20 + -8) = 0x3f76ba;
      pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_88,uVar23)
      ;
      *pvVar18 = vVar2;
      uVar10 = uVar10 + 1;
    }
    *(undefined8 *)(puVar20 + -8) = 0x3f76cd;
    IVar9 = BayesianGameBase::IndividualToJointTypeIndices
                      ((BayesianGameBase *)this_00,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_88);
    *(undefined8 *)(puVar20 + -8) = 0x3f76df;
    pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                        (&this->_m_jaohReps,(ulong)uVar26);
    *pvVar18 = IVar9;
    *(undefined8 *)(puVar20 + -8) = 0x3f76e9;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_88);
    uVar26 = uVar26 + 1;
  }
  return;
}

Assistant:

BayesianGameWithClusterInfo::BayesianGameWithClusterInfo(                
        const PlanningUnitDecPOMDPDiscrete* pu,
        const QFunctionJAOHInterface* q,
        const boost::shared_ptr<const PartialJointPolicyDiscretePure> &pastJPol,
        BGClusterAlgorithm clusterAlg
    )
        :
            BayesianGameForDecPOMDPStage(  pu, q, pastJPol ),
            _m_pBG()
            ,_m_qJB(dynamic_cast<const QFunctionJointBeliefInterface *>(q))
            ,_m_qHybrid(dynamic_cast<const QHybrid *>(q))
            ,_m_pBGJPol()
            ,_m_clusterAlgorithm(clusterAlg),
            _m_thresholdJB(0),
            _m_thresholdPjaoh(0)
{
    //extra stuff we need to do for cluster info...


    //Construct the individual type sets
    Index ts = GetStage();
    for(Index agI=0; agI < GetNrAgents(); agI++)
    {
        _m_typeLists.push_back( new TypeClusterList() );
        Index tcI = 0;
        Index fI = CastLIndexToIndex(GetPUDecPOMDPDiscrete()->GetFirstObservationHistoryIndex(agI, ts));
        for(Index typeI=0; typeI < GetNrTypes(agI); typeI++)
        {
            //the type corresponds to the observation history, offset by the
            //first ohI index for this stage
            Index ohI = typeI + fI;
            
            vector<Index> actions;
            vector<Index> observations;
            if(ts > 0)
            {
                Index obsArr[ts];
                Index acsArr[ts];
                GetPUDecPOMDPDiscrete()->GetObservationHistoryArrays(agI, ohI, ts, obsArr);
                Index ohI2 = 0;
                Index tI = 0;
                while(tI < ts)
                {
                    Index aI = pastJPol->GetActionIndex(agI, ohI2);
                    acsArr[tI] = aI;

                    Index next_oI = obsArr[tI];
                    ohI2 = GetPUDecPOMDPDiscrete()->GetSuccessorOHI(agI, ohI2, next_oI);
                    tI++;
                }
                actions = vector<Index>(acsArr[0], acsArr[ts-1]);
                observations = vector<Index>(obsArr[0], obsArr[ts-1]);
            }


            Index aohI = GetPUDecPOMDPDiscrete()->GetActionObservationHistoryIndex(agI, ts, 
                    actions, observations);
            Type_AOHIndex* t =  new Type_AOHIndex(aohI);
            TypeCluster* tc = new TypeCluster(tcI++);
            tc->AddType(t);
            ///store this type:
            _m_typeLists.at(agI)->push_back( tc );
        }
    }

    //on initialization we called BayesianGameForDecPOMDPStage(  pu, q, pastJPol ),
    //which is the public constructor of BayesianGameForDecPOMDPStage, which already
    //computed all joint types.
    //_m_JBs = vector< JointBeliefInterface* >(GetNrJointTypes());
    _m_jaohReps = vector< Index >( GetNrJointTypes() );

    //loop over joint types and store the joint beliefs.
    for(Index jtI=0; jtI < GetNrJointTypes(); jtI++)
    {
        //compute the jaohI
        const vector<Index>& indTypeIs = JointToIndividualTypeIndices(jtI);
        vector<Index> indAOHs(GetNrAgents());
        for(Index agI=0; agI < GetNrAgents(); agI++)
        {
            Index tI = indTypeIs.at(agI);
            TypeClusterList* tcl = _m_typeLists.at(agI);
            TypeCluster* tc =  tcl->at(tI);
            //we know there is just 1 element in this cluster (we just created
            //it above and only added 1 Type_AOHIndex )
            Type* t1 =  *(tc->begin());
            Type_AOHIndex* t =  dynamic_cast< Type_AOHIndex * >(t1);
            Index aohI = t->GetAOHIndex();
            indAOHs.at(agI) = aohI;
        }
        Index jaohI = IndividualToJointTypeIndices(indAOHs);
        _m_jaohReps.at(jtI) = jaohI;
        //the following returns a copy that should be deleted:
        //JointBeliefInterface* jb = GetPUDecPOMDPDiscrete()->GetJointBeliefInterface(jaohI);
        //_m_JBs.at(jtI) = jb;
    }


}